

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidgetPrivate::reparentWidgetWindows
          (QWidgetPrivate *this,QWidget *parentWithWindow,WindowFlags windowFlags)

{
  QWidgetData **ppQVar1;
  QWExtra *pQVar2;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar3;
  QWindow *pQVar4;
  QWidget *pQVar5;
  QDebug QVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QDebug local_a8;
  QDebug local_a0;
  QWindow local_98 [8];
  undefined1 local_90 [8];
  undefined4 local_88;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined4 local_74;
  char *local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QWindow local_50 [8];
  undefined1 local_48 [8];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (((pQVar2 == (QWExtra *)0x0) ||
      (tVar3.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
            *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
             &(pQVar2->topextra)._M_t.
              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
      tVar3.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
      (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) ||
     (pQVar4 = *(QWindow **)
                ((long)tVar3.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20),
     pQVar4 == (QWindow *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      reparentWidgetWindowChildren(this,parentWithWindow);
      return;
    }
    goto LAB_0030d0f0;
  }
  if (parentWithWindow == (QWidget *)0x0) {
    lcWidgetWindow();
    if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_88 = 2;
      local_84 = 0;
      uStack_7c = 0;
      local_74 = 0;
      local_70 = lcWidgetWindow::category.name;
      QMessageLogger::debug();
      QVar6.stream = local_68.stream;
      QVar7.m_data = (storage_type *)0x6;
      QVar7.m_size = (qsizetype)local_40;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_40);
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_68.stream,' ');
      }
      *(int *)((QTextStream *)local_68.stream + 0x28) =
           *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_58,(QWindow *)&local_a8);
      QVar6.stream = local_58.stream;
      QVar8.m_data = (storage_type *)0x10;
      QVar8.m_size = (qsizetype)local_40;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_40);
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_a8);
      QDebug::~QDebug(&local_68);
    }
LAB_0030d0bf:
    QWindow::setTransientParent(pQVar4);
  }
  else {
    if (((uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      do {
        pQVar5 = *(QWidget **)(*(long *)&parentWithWindow->field_0x8 + 0x10);
        if (pQVar5 == (QWidget *)0x0) break;
        ppQVar1 = &parentWithWindow->data;
        parentWithWindow = pQVar5;
      } while ((((*ppQVar1)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
      lcWidgetWindow();
      if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
         ) {
        local_88 = 2;
        local_84 = 0;
        uStack_7c = 0;
        local_74 = 0;
        local_70 = lcWidgetWindow::category.name;
        QMessageLogger::debug();
        QVar6.stream = local_68.stream;
        QVar11.m_data = (storage_type *)0x7;
        QVar11.m_size = (qsizetype)local_40;
        QString::fromUtf8(QVar11);
        QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_40);
        if (local_40[0] != (QArrayData *)0x0) {
          LOCK();
          (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_40[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_68.stream,' ');
        }
        *(int *)((QTextStream *)local_68.stream + 0x28) =
             *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
        ::operator<<((Stream *)&local_58,(QWindow *)&local_60);
        QVar6.stream = local_58.stream;
        QVar12.m_data = (storage_type *)0x13;
        QVar12.m_size = (qsizetype)local_40;
        QString::fromUtf8(QVar12);
        QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_40);
        if (local_40[0] != (QArrayData *)0x0) {
          LOCK();
          (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_40[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_58.stream,' ');
        }
        *(int *)((QTextStream *)local_58.stream + 0x28) =
             *(int *)((QTextStream *)local_58.stream + 0x28) + 1;
        ::operator<<((Stream *)local_48,local_50);
        QDebug::~QDebug((QDebug *)local_48);
        QDebug::~QDebug((QDebug *)local_50);
        QDebug::~QDebug(&local_58);
        QDebug::~QDebug(&local_60);
        QDebug::~QDebug(&local_68);
      }
      goto LAB_0030d0bf;
    }
    lcWidgetWindow();
    if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_88 = 2;
      local_84 = 0;
      uStack_7c = 0;
      local_74 = 0;
      local_70 = lcWidgetWindow::category.name;
      QMessageLogger::debug();
      QVar6.stream = local_68.stream;
      QVar9.m_data = &DAT_0000000b;
      QVar9.m_size = (qsizetype)local_40;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_40);
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_68.stream,' ');
      }
      *(int *)((QTextStream *)local_68.stream + 0x28) =
           *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_58,(QWindow *)&local_a0);
      QVar6.stream = local_58.stream;
      QVar10.m_data = (storage_type *)0x4;
      QVar10.m_size = (qsizetype)local_40;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_40);
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      *(int *)((QTextStream *)local_58.stream + 0x28) =
           *(int *)((QTextStream *)local_58.stream + 0x28) + 1;
      ::operator<<((Stream *)local_90,local_98);
      QDebug::~QDebug((QDebug *)local_90);
      QDebug::~QDebug((QDebug *)local_98);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_a0);
      QDebug::~QDebug(&local_68);
    }
    QWindow::setTransientParent(pQVar4);
  }
  QWindow::setParent(pQVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0030d0f0:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::reparentWidgetWindows(QWidget *parentWithWindow, Qt::WindowFlags windowFlags)
{
    if (QWindow *window = windowHandle()) {
        // Reparent this QWindow, and all QWindow children will follow
        if (parentWithWindow) {
            if (windowFlags & Qt::Window) {
                // Top level windows can only have transient parents,
                // and the transient parent must be another top level.
                QWidget *topLevel = parentWithWindow->window();
                auto *transientParent = topLevel->windowHandle();
                Q_ASSERT(transientParent);
                qCDebug(lcWidgetWindow) << "Setting" << window << "transient parent to" << transientParent;
                window->setTransientParent(transientParent);
                window->setParent(nullptr);
            } else {
                auto *parentWindow = parentWithWindow->windowHandle();
                qCDebug(lcWidgetWindow) << "Reparenting" << window << "into" << parentWindow;
                window->setTransientParent(nullptr);
                window->setParent(parentWindow);
            }
        } else {
            qCDebug(lcWidgetWindow) << "Making" << window << "top level window";
            window->setTransientParent(nullptr);
            window->setParent(nullptr);
        }
    } else {
        reparentWidgetWindowChildren(parentWithWindow);
    }
}